

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_opt_env.c
# Opt level: O0

void gravity_env_register_args(gravity_vm *vm,uint32_t _argc,char **_argv)

{
  size_t sVar1;
  gravity_value_r *pgVar2;
  gravity_value_t *pgVar3;
  gravity_value_t gVar4;
  size_t local_40;
  gravity_class_t *local_38;
  gravity_value_t arg;
  int i;
  char **_argv_local;
  uint32_t _argc_local;
  gravity_vm *vm_local;
  
  argc = _argc;
  argv = gravity_list_new(vm,_argc);
  for (arg.field_1.n._4_4_ = 0; (uint)arg.field_1.n._4_4_ < _argc;
      arg.field_1.n._4_4_ = arg.field_1.n._4_4_ + 1) {
    gVar4 = gravity_string_to_value(vm,_argv[(int)arg.field_1.n._4_4_],0xffffffff);
    if ((argv->array).n == (argv->array).m) {
      if ((argv->array).m == 0) {
        local_40 = 8;
      }
      else {
        local_40 = (argv->array).m << 1;
      }
      (argv->array).m = local_40;
      pgVar3 = (gravity_value_t *)realloc((argv->array).p,(argv->array).m << 4);
      (argv->array).p = pgVar3;
    }
    pgVar2 = &argv->array;
    sVar1 = (argv->array).n;
    (argv->array).n = sVar1 + 1;
    pgVar3 = pgVar2->p + sVar1;
    local_38 = gVar4.isa;
    pgVar3->isa = local_38;
    arg.isa = (gravity_class_t *)gVar4.field_1;
    (pgVar3->field_1).p = arg.isa;
  }
  return;
}

Assistant:

void gravity_env_register_args(gravity_vm *vm, uint32_t _argc, const char **_argv) {
    argc = _argc;
    argv = gravity_list_new(vm, argc);
    for (int i = 0; i < _argc; ++i) {
        gravity_value_t arg = VALUE_FROM_CSTRING(vm, _argv[i]);
        marray_push(gravity_value_t, argv->array, arg);
    }
}